

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  bool bVar1;
  ulong uVar2;
  char in_SIL;
  TestSpecParser *in_RDI;
  TestSpecParser *in_stack_ffffffffffffffd8;
  char c_00;
  undefined7 in_stack_ffffffffffffffe8;
  bool local_1;
  
  if ((in_RDI->m_mode == EscapedName) || (in_SIL != '\\')) {
    if ((in_RDI->m_mode == EscapedName) || (in_SIL != ',')) {
      uVar2 = (ulong)in_RDI->m_mode;
      c_00 = (char)((ulong)in_RDI >> 0x38);
      switch(uVar2) {
      case 0:
        bVar1 = processNoneChar((TestSpecParser *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),c_00);
        if (bVar1) {
          return true;
        }
        break;
      case 1:
        processNameChar(in_RDI,'\0');
        break;
      default:
        bVar1 = processOtherChar((TestSpecParser *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),c_00);
        if (bVar1) {
          return true;
        }
        break;
      case 4:
        endMode(in_RDI);
        addCharToPattern(in_RDI,(char)(uVar2 >> 0x38));
        return true;
      }
      std::__cxx11::string::operator+=((string *)&in_RDI->m_substring,in_SIL);
      bVar1 = isControlChar(in_RDI,in_SIL);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)&in_RDI->m_patternName,in_SIL);
        in_RDI->m_realPatternPos = in_RDI->m_realPatternPos + 1;
      }
      local_1 = true;
    }
    else {
      local_1 = separate(in_stack_ffffffffffffffd8);
    }
  }
  else {
    escape(in_RDI);
    addCharToPattern(in_RDI,(char)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool TestSpecParser::visitChar( char c ) {
        if( (m_mode != EscapedName) && (c == '\\') ) {
            escape();
            addCharToPattern(c);
            return true;
        }else if((m_mode != EscapedName) && (c == ',') )  {
            return separate();
        }

        switch( m_mode ) {
        case None:
            if( processNoneChar( c ) )
                return true;
            break;
        case Name:
            processNameChar( c );
            break;
        case EscapedName:
            endMode();
            addCharToPattern(c);
            return true;
        default:
        case Tag:
        case QuotedName:
            if( processOtherChar( c ) )
                return true;
            break;
        }

        m_substring += c;
        if( !isControlChar( c ) ) {
            m_patternName += c;
            m_realPatternPos++;
        }
        return true;
    }